

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chnsecal.cpp
# Opt level: O0

double __thiscall icu_63::ChineseCalendar::millisToDays(ChineseCalendar *this,double millis)

{
  UBool UVar1;
  double dVar2;
  UErrorCode local_2c;
  int local_28;
  UErrorCode status;
  int32_t dstOffset;
  int32_t rawOffset;
  double millis_local;
  ChineseCalendar *this_local;
  
  _dstOffset = millis;
  millis_local = (double)this;
  if (this->fZoneAstroCalc != (TimeZone *)0x0) {
    local_2c = U_ZERO_ERROR;
    (*(this->fZoneAstroCalc->super_UObject)._vptr_UObject[6])
              (millis,this->fZoneAstroCalc,0,&status,&local_28,&local_2c);
    UVar1 = ::U_SUCCESS(local_2c);
    if (UVar1 != '\0') {
      dVar2 = ClockMath::floorDivide(_dstOffset + (double)(status + local_28),86400000.0);
      return dVar2;
    }
  }
  dVar2 = ClockMath::floorDivide(_dstOffset + 28800000.0,86400000.0);
  return dVar2;
}

Assistant:

double ChineseCalendar::millisToDays(double millis) const {
    if (fZoneAstroCalc != NULL) {
        int32_t rawOffset, dstOffset;
        UErrorCode status = U_ZERO_ERROR;
        fZoneAstroCalc->getOffset(millis, FALSE, rawOffset, dstOffset, status);
        if (U_SUCCESS(status)) {
        	return ClockMath::floorDivide(millis + (double)(rawOffset + dstOffset), kOneDay);
        }
    }
    return ClockMath::floorDivide(millis + (double)CHINA_OFFSET, kOneDay);
}